

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

Saig_Bmc_t *
Saig_BmcManStart(Aig_Man_t *pAig,int nFramesMax,int nNodesMax,int nConfMaxOne,int nConfMaxAll,
                int fVerbose)

{
  Aig_Obj_t *pAVar1;
  uint uVar2;
  Saig_Bmc_t *p;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Aig_Man_t *pAVar7;
  sat_solver *s;
  int Fill;
  int iVar8;
  size_t __size;
  int Lit;
  lit local_34;
  
  p = (Saig_Bmc_t *)malloc(0x80);
  p->nFramesMax = 0;
  p->nNodesMax = 0;
  p->nConfMaxOne = 0;
  p->nConfMaxAll = 0;
  *(undefined8 *)&p->fVerbose = 0;
  p->pAig = (Aig_Man_t *)0x0;
  p->pFrm = (Aig_Man_t *)0x0;
  p->vVisited = (Vec_Int_t *)0x0;
  *(undefined8 *)&p->nObjs = 0;
  p->vAig2Frm = (Vec_Ptr_t *)0x0;
  p->pSat = (sat_solver *)0x0;
  *(undefined8 *)&p->nSatVars = 0;
  p->vObj2Var = (Vec_Int_t *)0x0;
  *(undefined8 *)&p->nStitchVars = 0;
  p->vTargets = (Vec_Ptr_t *)0x0;
  p->iFramePrev = 0;
  p->iFrameLast = 0;
  p->iOutputLast = 0;
  p->iFrameFail = 0;
  *(undefined8 *)&p->iOutputFail = 0;
  p->nFramesMax = nFramesMax;
  p->nNodesMax = nNodesMax;
  p->nConfMaxOne = nConfMaxOne;
  p->nConfMaxAll = nConfMaxAll;
  p->fVerbose = fVerbose;
  p->pAig = pAig;
  iVar8 = pAig->vObjs->nSize;
  p->nObjs = iVar8;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  p->vAig2Frm = pVVar3;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0;
  pVVar5->nSize = 0;
  pVVar5->pArray = (int *)0x0;
  p->vObj2Var = pVVar5;
  if (0 < (long)iVar8) {
    __size = (long)iVar8 << 2;
    piVar6 = (int *)malloc(__size);
    pVVar5->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = iVar8;
    if (0 < iVar8) {
      memset(pVVar5->pArray,0,__size);
    }
  }
  pVVar5->nSize = iVar8;
  pAVar7 = Aig_ManStart(iVar8);
  p->pFrm = pAVar7;
  if (0 < pAig->nRegs) {
    iVar8 = 0;
    do {
      uVar2 = pAig->nTruePis + iVar8;
      if (((int)uVar2 < 0) || (pAig->vCis->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Saig_BmcObjSetFrame(p,(Aig_Obj_t *)pAig->vCis->pArray[uVar2],0,
                          (Aig_Obj_t *)((ulong)pAVar7->pConst1 ^ 1));
      iVar8 = iVar8 + 1;
    } while (iVar8 < pAig->nRegs);
  }
  p->nSatVars = 1;
  s = sat_solver_new();
  p->pSat = s;
  s->nLearntDelta = 5000;
  s->nLearntRatio = 0x4b;
  s->nLearntMax = 10000;
  s->nLearntStart = 10000;
  sat_solver_setnvars(s,2000);
  sat_solver_addclause(s,&local_34,(lit *)&stack0xffffffffffffffd0);
  pAVar1 = pAVar7->pConst1;
  p->nSatVars = 2;
  iVar8 = pAVar1->Id;
  Vec_IntFillExtra(pVVar5,iVar8 + 1,Fill);
  if ((-1 < (long)iVar8) && (iVar8 < pVVar5->nSize)) {
    pVVar5->pArray[iVar8] = 1;
    pVVar3 = (Vec_Ptr_t *)malloc(0x10);
    pVVar3->nCap = 1000;
    pVVar3->nSize = 0;
    ppvVar4 = (void **)malloc(8000);
    pVVar3->pArray = ppvVar4;
    p->vTargets = pVVar3;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 1000;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(4000);
    pVVar5->pArray = piVar6;
    p->vVisited = pVVar5;
    p->iFrameFail = -1;
    p->iOutputFail = -1;
    return p;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Saig_Bmc_t * Saig_BmcManStart( Aig_Man_t * pAig, int nFramesMax, int nNodesMax, int nConfMaxOne, int nConfMaxAll, int fVerbose )
{
    Saig_Bmc_t * p;
    Aig_Obj_t * pObj;
    int i, Lit;
//    assert( Aig_ManRegNum(pAig) > 0 );
    p = (Saig_Bmc_t *)ABC_ALLOC( char, sizeof(Saig_Bmc_t) );
    memset( p, 0, sizeof(Saig_Bmc_t) );
    // set parameters
    p->nFramesMax   = nFramesMax;
    p->nNodesMax    = nNodesMax;
    p->nConfMaxOne  = nConfMaxOne;
    p->nConfMaxAll  = nConfMaxAll;
    p->fVerbose     = fVerbose;
    p->pAig         = pAig;
    p->nObjs        = Aig_ManObjNumMax(pAig);
    // create node and variable mappings
    p->vAig2Frm     = Vec_PtrAlloc( 100 );
    p->vObj2Var     = Vec_IntAlloc( 0 );
    Vec_IntFill( p->vObj2Var, p->nObjs, 0 );
    // start the AIG manager and map primary inputs
    p->pFrm         = Aig_ManStart( p->nObjs );
    Saig_ManForEachLo( pAig, pObj, i )
        Saig_BmcObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrm) ); 
    // create SAT solver
    p->nSatVars     = 1;
    p->pSat         = sat_solver_new();
    p->pSat->nLearntStart = 10000;//p->pPars->nLearnedStart;
    p->pSat->nLearntDelta =  5000;//p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio =    75;//p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    sat_solver_setnvars( p->pSat, 2000 );
    Lit = toLit( p->nSatVars );
    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    Saig_BmcSetSatNum( p, Aig_ManConst1(p->pFrm), p->nSatVars++ );
    // other data structures
    p->vTargets     = Vec_PtrAlloc( 1000 );
    p->vVisited     = Vec_IntAlloc( 1000 );
    p->iOutputFail  = -1;
    p->iFrameFail   = -1;
    return p;
}